

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ExpressionsTypeRestrictions1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsTypeRestrictions1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  ulong *puVar4;
  TestError *pTVar5;
  long *plVar6;
  long lVar7;
  string shader_source;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  ExpressionsTypeRestrictions1<glcts::ArraysOfArrays::Interface::ES> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar7 = 0;
  local_58 = this;
  do {
    lVar1 = 0x2238c78;
    if (supported_variable_types_map._16_8_ != 0) {
      lVar1 = 0x2238c78;
      lVar2 = supported_variable_types_map._16_8_;
      do {
        if ((int)(&opaque_var_types)[lVar7] <= *(int *)(lVar2 + 0x20)) {
          lVar1 = lVar2;
        }
        lVar2 = *(long *)(lVar2 + 0x10 +
                         (ulong)(*(int *)(lVar2 + 0x20) < (int)(&opaque_var_types)[lVar7]) * 8);
      } while (lVar2 != 0);
    }
    lVar2 = 0x2238c78;
    if ((lVar1 != 0x2238c78) &&
       (lVar2 = lVar1, (int)(&opaque_var_types)[lVar7] < *(int *)(lVar1 + 0x20))) {
      lVar2 = 0x2238c78;
    }
    if (lVar2 == 0x2238c78) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xb57);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::operator+(&local_50,"uniform ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar2 + 0x48));
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_138 = &local_128;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_128 = *plVar6;
      lStack_120 = plVar3[3];
    }
    else {
      local_128 = *plVar6;
      local_138 = (long *)*plVar3;
    }
    local_130 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_138,*(ulong *)(lVar2 + 0x28));
    local_118 = &local_108;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_108 = *plVar6;
      lStack_100 = plVar3[3];
    }
    else {
      local_108 = *plVar6;
      local_118 = (long *)*plVar3;
    }
    local_110 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_118);
    local_f8 = &local_e8;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_e8 = *plVar6;
      lStack_e0 = plVar3[3];
    }
    else {
      local_e8 = *plVar6;
      local_f8 = (long *)*plVar3;
    }
    local_f0 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,*(ulong *)(lVar2 + 0x48));
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_a8 = *plVar6;
      lStack_a0 = plVar3[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar6;
      local_b8 = (long *)*plVar3;
    }
    local_b0 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_88 = *plVar6;
      lStack_80 = plVar3[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar6;
      local_98 = (long *)*plVar3;
    }
    local_90 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_98,*(ulong *)(lVar2 + 0x28));
    local_d8 = &local_c8;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_c8 = *plVar6;
      lStack_c0 = plVar3[3];
    }
    else {
      local_c8 = *plVar6;
      local_d8 = (long *)*plVar3;
    }
    local_d0 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_68 = *plVar6;
      lStack_60 = plVar3[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar6;
      local_78 = (long *)*plVar3;
    }
    local_70 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_78,shader_start_abi_cxx11_);
    std::__cxx11::string::append((char *)&local_78);
    puVar4 = &set_tesseation_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
    case COMPUTE_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)&local_78);
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar4 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)&local_78,*puVar4);
      break;
    default:
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xb50);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::_M_append((char *)&local_78,shader_end_abi_cxx11_);
    (*(local_58->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
      super_TestNode._vptr_TestNode[8])(local_58,(ulong)tested_shader_type,&local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xf);
  return;
}

Assistant:

void ExpressionsTypeRestrictions1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	int num_var_types = sizeof(opaque_var_types) / sizeof(opaque_var_types[0]);

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(opaque_var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string shader_source =
				"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " var1[2][2];\n"
																								"uniform " +
				var_iterator->second.precision + " " + var_iterator->second.type + " var2[2][2];\n\n";
			shader_source += shader_start;

			shader_source += "    var1 = var2;\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			this->execute_negative_test(tested_shader_type, shader_source);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}